

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O3

string * __thiscall
wallet::TxStateUnrecognized::toString_abi_cxx11_
          (string *__return_storage_ptr__,TxStateUnrecognized *this)

{
  int *in_R8;
  long in_FS_OFFSET;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  base_blob<256u>::ToString_abi_cxx11_(&local_40,this);
  tinyformat::format<std::__cxx11::string,int>
            (__return_storage_ptr__,(tinyformat *)"Unrecognized (block=%s, index=%i)",
             (char *)&local_40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->index,in_R8
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string toString() const { return strprintf("Unrecognized (block=%s, index=%i)", block_hash.ToString(), index); }